

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

int Spl_ManComputeOne(Spl_Man_t *p,int iPivot)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint Id;
  uint fReverse;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)iPivot;
  iVar1 = Gia_ObjIsLut2(p->pGia,iPivot);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut2(p->pGia, iPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x1d0,"int Spl_ManComputeOne(Spl_Man_t *, int)");
  }
  for (iVar1 = 0; iVar1 < p->vNodes->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p->vNodes,iVar1);
    Vec_BitWriteEntry(p->vMarksNo,iVar2,0);
  }
  for (iVar1 = 0; p_00 = p->vAnds, iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar1);
    Vec_BitWriteEntry(p->vMarksAnd,iVar2,0);
  }
  p->vNodes->nSize = 0;
  p_00->nSize = 0;
  Spl_ManLutMffcSize(p->pGia,iPivot,p->vCands,p->vMarksAnd);
  Spl_ManAddNode(p,iPivot,p->vCands);
  iVar1 = 0;
  if (p->vAnds->nSize <= p->Limit) {
    while( true ) {
      fReverse = (uint)uVar3;
      Id = Spl_ManFindOne(p);
      if (Id == 0) break;
      iVar1 = Gia_ObjIsLut2(p->pGia,Id);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0x1e8,"int Spl_ManComputeOne(Spl_Man_t *, int)");
      }
      iVar1 = Vec_BitEntry(p->vMarksNo,Id);
      if (iVar1 != 0) {
        __assert_fail("!Vec_BitEntry(p->vMarksNo, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0x1e9,"int Spl_ManComputeOne(Spl_Man_t *, int)");
      }
      fReverse = Id;
      iVar1 = Spl_ManLutMffcSize(p->pGia,Id,p->vCands,p->vMarksAnd);
      if (p->Limit < iVar1 + p->vAnds->nSize) break;
      uVar3 = (ulong)Id;
      Spl_ManAddNode(p,Id,p->vCands);
    }
    Vec_IntSort(p->vNodes,fReverse);
    Vec_IntSort(p->vAnds,fReverse);
    Spl_ManWinFindLeavesRoots(p);
    Vec_IntSort(p->vLeaves,fReverse);
    Vec_IntSort(p->vRoots,fReverse);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Spl_ManComputeOne( Spl_Man_t * p, int iPivot )
{
    int CountAdd, iObj, i;
    assert( Gia_ObjIsLut2(p->pGia, iPivot) );
//Gia_ManPrintCone2( p->pGia, Gia_ManObj(p->pGia, iPivot) );
    // assume it was previously filled in
    Vec_IntForEachEntry( p->vNodes, iObj, i )
        Vec_BitWriteEntry( p->vMarksNo, iObj, 0 );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        Vec_BitWriteEntry( p->vMarksAnd, iObj, 0 );
    // double check that it is empty
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksNo, iObj) );
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksAnd, iObj) );
    // clean arrays
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vAnds );
    // add root node
    Spl_ManLutMffcSize( p->pGia, iPivot, p->vCands, p->vMarksAnd );
    Spl_ManAddNode( p, iPivot, p->vCands );
    if ( Vec_IntSize(p->vAnds) > p->Limit )
        return 0;
    //printf( "%d ", iPivot );
    // add one node at a time
    while ( (iObj = Spl_ManFindOne(p)) )
    {
        assert( Gia_ObjIsLut2(p->pGia, iObj) );
        assert( !Vec_BitEntry(p->vMarksNo, iObj) );
        CountAdd = Spl_ManLutMffcSize( p->pGia, iObj, p->vCands, p->vMarksAnd );
        if ( Vec_IntSize(p->vAnds) + CountAdd > p->Limit )
            break;
        Spl_ManAddNode( p, iObj, p->vCands );
        //printf( "+%d ", iObj );
    }
    //printf( "\n" );
    Vec_IntSort( p->vNodes, 0 );
    Vec_IntSort( p->vAnds, 0 );
    Spl_ManWinFindLeavesRoots( p );
    Vec_IntSort( p->vLeaves, 0 );
    Vec_IntSort( p->vRoots, 0 );
    return 1;
}